

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_list.c
# Opt level: O3

void list_store_list(t_list_store *x,t_symbol *s,int argc,t_atom *argv)

{
  undefined8 *puVar1;
  int count;
  _outlet *p_Var2;
  undefined8 uVar3;
  word wVar4;
  t_atom *argv_00;
  long lVar5;
  undefined8 *puVar6;
  long lVar7;
  uint argc_00;
  long lVar8;
  t_atom *ptVar9;
  t_atom *ptVar10;
  undefined1 auStack_58 [16];
  t_alist y;
  
  ptVar10 = (t_atom *)auStack_58;
  lVar8 = (long)argc;
  y.l_vec = (t_listelem *)((x->x_alist).l_n + lVar8);
  if ((int)y.l_vec < 100) {
    ptVar10 = (t_atom *)(auStack_58 + (long)y.l_vec * -0x10);
    argv_00 = ptVar10;
  }
  else {
    argv_00 = (t_atom *)getbytes(((ulong)y.l_vec & 0xffffffff) << 4);
  }
  if (0 < argc) {
    lVar5 = 0;
    do {
      puVar6 = (undefined8 *)((long)&argv->a_type + lVar5);
      uVar3 = puVar6[1];
      puVar1 = (undefined8 *)((long)&argv_00->a_type + lVar5);
      *puVar1 = *puVar6;
      puVar1[1] = uVar3;
      lVar5 = lVar5 + 0x10;
    } while ((ulong)(uint)argc << 4 != lVar5);
  }
  if ((x->x_alist).l_npointer == 0) {
    lVar5 = (long)(x->x_alist).l_n;
    if (0 < lVar5) {
      ptVar9 = argv_00 + lVar8;
      lVar8 = 0;
      do {
        puVar6 = (undefined8 *)((long)&(((x->x_alist).l_vec)->l_a).a_type + lVar8);
        wVar4 = *(word *)(puVar6 + 1);
        *(undefined8 *)ptVar9 = *puVar6;
        ptVar9->a_w = wVar4;
        lVar8 = lVar8 + 0x28;
        ptVar9 = ptVar9 + 1;
      } while (lVar5 * 0x28 != lVar8);
    }
    p_Var2 = x->x_out1;
    argc_00 = (uint)y.l_vec;
    ptVar10[-1].a_w.w_symbol = (t_symbol *)0x183f98;
    outlet_list(p_Var2,&s_list,argc_00,argv_00);
  }
  else {
    count = (x->x_alist).l_n;
    ptVar10[-1].a_w.w_symbol = (t_symbol *)0x183efb;
    alist_clone(&x->x_alist,(t_alist *)(auStack_58 + 8),0,count);
    lVar5 = (long)(x->x_alist).l_n;
    if (0 < lVar5) {
      lVar7 = 0;
      puVar6 = (undefined8 *)y._8_8_;
      do {
        uVar3 = puVar6[1];
        puVar1 = (undefined8 *)((long)&argv_00[lVar8].a_type + lVar7);
        *puVar1 = *puVar6;
        puVar1[1] = uVar3;
        lVar7 = lVar7 + 0x10;
        puVar6 = puVar6 + 5;
      } while (lVar5 * 0x10 != lVar7);
    }
    p_Var2 = x->x_out1;
    argc_00 = (uint)y.l_vec;
    ptVar10[-1].a_w.w_symbol = (t_symbol *)0x183f42;
    outlet_list(p_Var2,&s_list,argc_00,argv_00);
    ptVar10[-1].a_w.w_symbol = (t_symbol *)0x183f4b;
    alist_clear((t_alist *)(auStack_58 + 8));
  }
  if (99 < (int)argc_00) {
    ptVar10[-1].a_w.w_symbol = (t_symbol *)0x183fab;
    freebytes(argv_00,(ulong)argc_00 << 4);
  }
  return;
}

Assistant:

static void list_store_list(t_list_store *x, t_symbol *s,
    int argc, t_atom *argv)
{
    t_atom *outv;
    int n, outc = x->x_alist.l_n + argc;
    ATOMS_ALLOCA(outv, outc);
    atoms_copy(argc, argv, outv);
    if (x->x_alist.l_npointer)
    {
        t_alist y;
        alist_clone(&x->x_alist, &y, 0, x->x_alist.l_n);
        alist_toatoms(&y, outv+argc, 0, x->x_alist.l_n);
        outlet_list(x->x_out1, &s_list, outc, outv);
        alist_clear(&y);
    }
    else
    {
        alist_toatoms(&x->x_alist, outv+argc, 0, x->x_alist.l_n);
        outlet_list(x->x_out1, &s_list, outc, outv);
    }
    ATOMS_FREEA(outv, outc);
}